

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnMemoryInit(SharedValidator *this,Location *loc,Var *segment_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  MemoryType mt;
  Limits local_d8;
  Var local_b8;
  Var local_70;
  
  local_d8.initial = 0;
  local_d8.max._0_7_ = 0;
  local_d8._15_4_ = 0;
  this->expr_loc_ = loc;
  Var::Var(&local_70,0,loc);
  RVar1 = CheckMemoryIndex(this,&local_70,(MemoryType *)&local_d8);
  Var::~Var(&local_70);
  Var::Var(&local_b8,segment_var);
  RVar2 = CheckDataSegmentIndex(this,&local_b8);
  Var::~Var(&local_b8);
  if (segment_var->type_ == Index) {
    RVar3 = TypeChecker::OnMemoryInit(&this->typechecker_,(segment_var->field_2).index_,&local_d8);
    RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
    RVar1.enum_._1_3_ = 0;
    return (Result)RVar1.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.h",
                0x38,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnMemoryInit(const Location& loc, Var segment_var) {
  Result result = Result::Ok;
  MemoryType mt;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc), &mt);
  result |= CheckDataSegmentIndex(segment_var);
  result |= typechecker_.OnMemoryInit(segment_var.index(), mt.limits);
  return result;
}